

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

event_base * event_init(void)

{
  event_base *peVar1;
  
  peVar1 = event_base_new_with_config((event_config *)0x0);
  if (peVar1 != (event_base *)0x0) {
    event_global_current_base_ = peVar1;
    return peVar1;
  }
  event_errx(1,"%s: Unable to construct event_base","event_init");
}

Assistant:

struct event_base *
event_init(void)
{
	struct event_base *base = event_base_new_with_config(NULL);

	if (base == NULL) {
		event_errx(1, "%s: Unable to construct event_base", __func__);
		return NULL;
	}

	current_base = base;

	return (base);
}